

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::doAnalysis::Mapper::create(Mapper *this)

{
  long in_RSI;
  pointer local_20;
  
  std::
  make_unique<wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>&)>)::Mapper,wasm::Module&,std::map<wasm::Function*,std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>>>>&,std::function<void(wasm::Function*,std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>&)>&>
            ((Module *)&stack0xffffffffffffffe0,
             *(map<wasm::Function_*,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>_>
               **)(in_RSI + 0x130),
             *(function<void_(wasm::Function_*,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_&)>
               **)(in_RSI + 0x138));
  *(pointer *)this = local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }